

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::ArePseudoClassesSet(Element *this,StringList *pseudo_classes)

{
  String *pSVar1;
  bool bVar2;
  String *pseudo_class;
  bool bVar3;
  
  pseudo_class = (pseudo_classes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (pseudo_classes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = pseudo_class == pSVar1;
  if ((!bVar3) && (bVar2 = ElementStyle::IsPseudoClassSet(&this->meta->style,pseudo_class), bVar2))
  {
    do {
      pseudo_class = pseudo_class + 1;
      bVar3 = pseudo_class == pSVar1;
      if (bVar3) {
        return bVar3;
      }
      bVar2 = ElementStyle::IsPseudoClassSet(&this->meta->style,pseudo_class);
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

ElementStyle* Element::GetStyle() const
{
	return &meta->style;
}